

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::OneofDescriptorProto::OneofDescriptorProto
          (OneofDescriptorProto *this,OneofDescriptorProto *from)

{
  bool bVar1;
  InternalMetadataWithArena *this_00;
  ArenaStringPtr *this_01;
  string *default_value;
  Arena *this_02;
  OneofOptions *pOVar2;
  OneofDescriptorProto *in_RSI;
  OneofDescriptorProto *in_RDI;
  Arena *in_stack_ffffffffffffff18;
  OneofDescriptorProto *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  OneofOptions *in_stack_ffffffffffffff68;
  OneofOptions *in_stack_ffffffffffffff70;
  OneofOptions *local_20;
  
  Message::Message(&in_stack_ffffffffffffff20->super_Message);
  (in_RDI->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__OneofDescriptorProto_00963570;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  (in_RDI->_has_bits_).has_bits_[0] = (in_RSI->_has_bits_).has_bits_[0];
  internal::CachedSize::CachedSize((CachedSize *)0x51337b);
  this_00 = &in_RSI->_internal_metadata_;
  local_20 = in_stack_ffffffffffffff68;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_20 = (OneofOptions *)
                 internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_00);
    }
    else {
      in_stack_ffffffffffffff70 =
           (OneofOptions *)internal::InternalMetadataWithArena::default_instance();
      local_20 = in_stack_ffffffffffffff70;
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)in_stack_ffffffffffffff20,
               (UnknownFieldSet *)in_stack_ffffffffffffff18);
  }
  this_01 = &in_RDI->name_;
  default_value = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault(this_01,default_value);
  bVar1 = _internal_has_name(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    _internal_name_abi_cxx11_((OneofDescriptorProto *)0x5134fd);
    this_02 = GetArenaNoVirtual(in_stack_ffffffffffffff20);
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)this_02,
               (string *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
               (string *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  bVar1 = _internal_has_options(in_RDI);
  if (bVar1) {
    pOVar2 = (OneofOptions *)operator_new(0x48);
    OneofOptions::OneofOptions(in_stack_ffffffffffffff70,local_20);
    in_RDI->options_ = pOVar2;
  }
  else {
    in_RDI->options_ = (OneofOptions *)0x0;
  }
  return;
}

Assistant:

OneofDescriptorProto::OneofDescriptorProto(const OneofDescriptorProto& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_name()) {
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_name(),
      GetArenaNoVirtual());
  }
  if (from._internal_has_options()) {
    options_ = new PROTOBUF_NAMESPACE_ID::OneofOptions(*from.options_);
  } else {
    options_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.OneofDescriptorProto)
}